

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall
cmMakefile::ListFileScope::ListFileScope(ListFileScope *this,cmMakefile *mf,string *filenametoread)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmState *this_00;
  cmStateSnapshot local_48;
  cmListFileBacktrace local_30;
  string *local_20;
  string *filenametoread_local;
  cmMakefile *mf_local;
  ListFileScope *this_local;
  
  this->Makefile = mf;
  this->ReportError = true;
  local_20 = filenametoread;
  filenametoread_local = (string *)mf;
  mf_local = (cmMakefile *)this;
  cmListFileBacktrace::Push(&local_30,(string *)&this->Makefile->Backtrace);
  cmListFileBacktrace::operator=(&this->Makefile->Backtrace,&local_30);
  cmListFileBacktrace::~cmListFileBacktrace(&local_30);
  this_00 = GetState(this->Makefile);
  cmState::CreateInlineListFileSnapshot(&local_48,this_00,&this->Makefile->StateSnapshot,local_20);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).State = local_48.State;
  (pcVar1->StateSnapshot).Position.Tree = local_48.Position.Tree;
  (pcVar1->StateSnapshot).Position.Position = local_48.Position.Position;
  bVar2 = cmStateSnapshot::IsValid(&this->Makefile->StateSnapshot);
  if (!bVar2) {
    __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                  ,0x25a,
                  "cmMakefile::ListFileScope::ListFileScope(cmMakefile *, const std::string &)");
  }
  PushFunctionBlockerBarrier(this->Makefile);
  return;
}

Assistant:

ListFileScope(cmMakefile* mf, std::string const& filenametoread)
    : Makefile(mf)
    , ReportError(true)
  {
    this->Makefile->Backtrace = this->Makefile->Backtrace.Push(filenametoread);

    this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateInlineListFileSnapshot(
        this->Makefile->StateSnapshot, filenametoread);
    assert(this->Makefile->StateSnapshot.IsValid());

    this->Makefile->PushFunctionBlockerBarrier();
  }